

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

cmSourceGroup * __thiscall cmSourceGroup::LookupChild(cmSourceGroup *this,string *name)

{
  bool bVar1;
  __type _Var2;
  pointer this_00;
  reference this_01;
  string *__lhs;
  cmSourceGroup *group;
  iterator __end1;
  iterator __begin1;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__range1;
  string *name_local;
  cmSourceGroup *this_local;
  
  this_00 = std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::
            operator->(&this->Internal);
  __end1 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin
                     (&this_00->GroupChildren);
  group = (cmSourceGroup *)
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end(&this_00->GroupChildren);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                                *)&group);
    if (!bVar1) {
      return (cmSourceGroup *)0x0;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
              ::operator*(&__end1);
    __lhs = GetName_abi_cxx11_(this_01);
    _Var2 = std::operator==(__lhs,name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
    ::operator++(&__end1);
  }
  return this_01;
}

Assistant:

cmSourceGroup* cmSourceGroup::LookupChild(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    // look if descenened is the one were looking for
    if (group.GetName() == name) {
      return (&group); // if it so return it
    }
  }

  // if no child with this name was found return NULL
  return nullptr;
}